

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_store_halfword.c
# Opt level: O1

void load_store_halfword(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  
  uVar1 = thminstr->raw;
  uVar2 = *(uint *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c));
  uVar4 = (uVar1 >> 5 & 0x3e) + uVar2;
  if ((uVar1 >> 0xb & 1) == 0) {
    (*state->write_half)(uVar4,(uint16_t)state->r[uVar1 & 7],ACCESS_NONSEQUENTIAL);
    return;
  }
  uVar3 = (*state->read_half)(uVar4,ACCESS_NONSEQUENTIAL);
  uVar4 = arm_ror((status_register_t *)0x0,(uint)uVar3,(uVar2 & 1) << 3);
  uVar1 = thminstr->raw;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar1 & 7),(ulong)uVar4);
  }
  state->r[uVar1 & 7] = uVar4;
  (*state->cpu_idle)(1);
  return;
}

Assistant:

void load_store_halfword(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    load_store_halfword_t* instr = &thminstr->LOAD_STORE_HALFWORD;
    word addr = get_register(state, instr->rb) + (instr->offset << 1);
    if (instr->l) {
        word value = state->read_half(addr, ACCESS_NONSEQUENTIAL);
        value = arm_ror(NULL, value, (addr & 0x1) << 3);
        set_register(state, instr->rd, value);
        state->cpu_idle(1);
    } else {
        half value = get_register(state, instr->rd) & 0xFFFF;
        state->write_half(addr, value, ACCESS_NONSEQUENTIAL);
    }
}